

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void OPL::DOSBox::DBOPL::InitTables(void)

{
  undefined2 uVar1;
  uint uVar2;
  undefined2 uVar3;
  undefined1 *puVar4;
  int i_1;
  ulong uVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  int oct;
  ushort uVar10;
  int i_2;
  long lVar11;
  char cVar12;
  uint uVar13;
  int i;
  long lVar14;
  short *psVar15;
  double dVar16;
  
  if (doneTables == '\0') {
    doneTables = '\x01';
    iVar8 = 0xff;
    for (lVar14 = 0; lVar14 != 0x300; lVar14 = lVar14 + 2) {
      dVar16 = exp2((double)iVar8 * 0.00390625 + -1.0);
      *(short *)((long)&MulTable + lVar14) = (short)(int)(dVar16 * 65536.0 + 0.5);
      iVar8 = iVar8 + -8;
    }
    for (lVar14 = 0; lVar14 != 0x200; lVar14 = lVar14 + 1) {
      dVar16 = sin(((double)(int)lVar14 + 0.5) * 0.006135923151542565);
      sVar6 = (short)(int)(dVar16 * 4084.0);
      (&DAT_0010b6c0)[lVar14] = sVar6;
      (&WaveTable)[lVar14] = -sVar6;
    }
    iVar8 = 0xff;
    psVar15 = &DAT_0010c0c0;
    for (lVar14 = 0; uVar3 = WaveTable, lVar14 != -0x100; lVar14 = lVar14 + -1) {
      dVar16 = exp2((double)iVar8 * 0.00390625 + -1.0);
      sVar6 = (short)(int)(dVar16 * 4085.0 + 0.5);
      *psVar15 = sVar6;
      (&DAT_0010c0be)[lVar14] = -sVar6;
      iVar8 = iVar8 + -8;
      psVar15 = psVar15 + 1;
    }
    for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 1) {
      (&DAT_0010bac0)[lVar14] = uVar3;
      (&DAT_0010bcc0)[lVar14] = uVar3;
      (&DAT_0010c4c0)[lVar14] = uVar3;
      (&DAT_0010cac0)[lVar14] = uVar3;
      (&DAT_0010ccc0)[lVar14] = uVar3;
      (&DAT_0010c2c0)[lVar14] = (&DAT_0010b6c0)[lVar14];
      (&DAT_0010c6c0)[lVar14] = (&DAT_0010b6c0)[lVar14 * 2];
      (&DAT_0010c8c0)[lVar14] = (&WaveTable)[lVar14 * 2];
      uVar1 = (&DAT_0010b6c0)[lVar14 * 2];
      (&DAT_0010cec0)[lVar14] = uVar1;
      (&DAT_0010d0c0)[lVar14] = uVar1;
    }
    puVar4 = &KslTable;
    for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        iVar8 = (int)lVar14 * 8 - (uint)(byte)(&KslCreateTable)[lVar11];
        cVar12 = (char)iVar8;
        if (iVar8 < 1) {
          cVar12 = '\0';
        }
        puVar4[lVar11] = cVar12 << 2;
      }
      puVar4 = puVar4 + 0x10;
    }
    puVar4 = &DAT_0010d743;
    for (lVar14 = 0; lVar14 != 0x1a; lVar14 = lVar14 + 1) {
      (&TremoloTable)[lVar14] = (char)lVar14;
      *puVar4 = (char)lVar14;
      puVar4 = puVar4 + -1;
    }
    psVar15 = &ChanOffsetTable;
    for (uVar5 = 0; uVar5 != 0x20; uVar5 = uVar5 + 1) {
      uVar7 = (uint)uVar5 & 0xf;
      uVar10 = (ushort)uVar7;
      if (uVar7 < 9) {
        if (uVar7 < 6) {
          uVar9 = uVar10 * 2 - 6;
          if (2 >= uVar7) {
            uVar9 = uVar10 * 2;
          }
          uVar10 = 2 < uVar7 | uVar9;
        }
        uVar9 = uVar10 + 9;
        if (uVar5 < 0x10) {
          uVar9 = uVar10;
        }
        sVar6 = uVar9 * 0xf8 + 0x2b8;
      }
      else {
        sVar6 = 0;
      }
      *psVar15 = sVar6;
      psVar15 = psVar15 + 1;
    }
    psVar15 = &OpOffsetTable;
    for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
      uVar7 = (uint)uVar5 & 7;
      if ((~(uint)uVar5 & 0x18) == 0 || 5 < uVar7) {
        sVar6 = 0;
      }
      else {
        uVar2 = uVar7 - 3;
        if (uVar7 < 3) {
          uVar2 = uVar7;
        }
        sVar6 = 0;
        if (uVar7 >= 3) {
          sVar6 = 0x68;
        }
        iVar8 = ((uint)(uVar5 >> 3) & 0x1fffffff) * 3;
        uVar13 = uVar2 + iVar8;
        uVar7 = uVar2 + 4 + iVar8;
        if (uVar13 < 0xc) {
          uVar7 = uVar13;
        }
        sVar6 = sVar6 + (&ChanOffsetTable)[uVar7];
      }
      *psVar15 = sVar6;
      psVar15 = psVar15 + 1;
    }
  }
  return;
}

Assistant:

void InitTables( void ) {
	if ( doneTables )
		return;
	doneTables = true;
#if ( DBOPL_WAVE == WAVE_HANDLER ) || ( DBOPL_WAVE == WAVE_TABLELOG )
	//Exponential volume table, same as the real adlib
	for ( int i = 0; i < 256; i++ ) {
		//Save them in reverse
		ExpTable[i] = (int)( 0.5 + ( pow(2.0, ( 255 - i) * ( 1.0 /256 ) )-1) * 1024 );
		ExpTable[i] += 1024; //or remove the -1 oh well :)
		//Preshift to the left once so the final volume can shift to the right
		ExpTable[i] *= 2;
	}
#endif
#if ( DBOPL_WAVE == WAVE_HANDLER )
	//Add 0.5 for the trunc rounding of the integer cast
	//Do a PI sinetable instead of the original 0.5 PI
	for ( int i = 0; i < 512; i++ ) {
		SinTable[i] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLEMUL )
	//Multiplication based tables
	for ( int i = 0; i < 384; i++ ) {
		int s = i * 8;
		//TODO maybe keep some of the precision errors of the original table?
		double val = ( 0.5 + ( pow(2.0, -1.0 + ( 255 - s) * ( 1.0 /256 ) )) * ( 1 << MUL_SH ));
		MulTable[i] = (Bit16u)(val);
	}

	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)(sin( (i + 0.5) * (M_PI / 512.0) ) * 4084);
		WaveTable[ 0x0000 + i ] = -WaveTable[ 0x200 + i ];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = (Bit16s)( 0.5 + ( pow(2.0, -1.0 + ( 255 - i * 8) * ( 1.0 /256 ) ) ) * 4085 );
		WaveTable[ 0x6ff - i ] = -WaveTable[ 0x700 + i ];
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLELOG )
	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
		WaveTable[ 0x0000 + i ] = ((Bit16s)0x8000) | WaveTable[ 0x200 + i];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = i * 8;
		WaveTable[ 0x6ff - i ] = ((Bit16s)0x8000) | i * 8;
	}
#endif

	//	|    |//\\|____|WAV7|//__|/\  |____|/\/\|
	//	|\\//|    |    |WAV7|    |  \/|    |    |
	//	|06  |0126|27  |7   |3   |4   |4 5 |5   |

#if (( DBOPL_WAVE == WAVE_TABLELOG ) || ( DBOPL_WAVE == WAVE_TABLEMUL ))
	for ( int i = 0; i < 256; i++ ) {
		//Fill silence gaps
		WaveTable[ 0x400 + i ] = WaveTable[0];
		WaveTable[ 0x500 + i ] = WaveTable[0];
		WaveTable[ 0x900 + i ] = WaveTable[0];
		WaveTable[ 0xc00 + i ] = WaveTable[0];
		WaveTable[ 0xd00 + i ] = WaveTable[0];
		//Replicate sines in other pieces
		WaveTable[ 0x800 + i ] = WaveTable[ 0x200 + i ];
		//double speed sines
		WaveTable[ 0xa00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xb00 + i ] = WaveTable[ 0x000 + i * 2 ];
		WaveTable[ 0xe00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xf00 + i ] = WaveTable[ 0x200 + i * 2 ];
	}
#endif

	//Create the ksl table
	for ( int oct = 0; oct < 8; oct++ ) {
		int base = oct * 8;
		for ( int i = 0; i < 16; i++ ) {
			int val = base - KslCreateTable[i];
			if ( val < 0 )
				val = 0;
			//*4 for the final range to match attenuation range
			KslTable[ oct * 16 + i ] = val * 4;
		}
	}
	//Create the Tremolo table, just increase and decrease a triangle wave
	for ( Bit8u i = 0; i < TREMOLO_TABLE / 2; i++ ) {
		Bit8u val = i << ENV_EXTRA;
		TremoloTable[i] = val;
		TremoloTable[TREMOLO_TABLE - 1 - i] = val;
	}
	//Create a table with offsets of the channels from the start of the chip
	DBOPL::Chip* chip = 0;
	for ( Bitu i = 0; i < 32; i++ ) {
		Bitu index = i & 0xf;
		if ( index >= 9 ) {
			ChanOffsetTable[i] = 0;
			continue;
		}
		//Make sure the four op channels follow eachother
		if ( index < 6 ) {
			index = (index % 3) * 2 + ( index / 3 );
		}
		//Add back the bits for highest ones
		if ( i >= 16 )
			index += 9;
		Bitu blah = reinterpret_cast<size_t>( &(chip->chan[ index ]) );
		ChanOffsetTable[i] = blah;
	}
	//Same for operators
	for ( Bitu i = 0; i < 64; i++ ) {
		if ( i % 8 >= 6 || ( (i / 8) % 4 == 3 ) ) {
			OpOffsetTable[i] = 0;
			continue;
		}
		Bitu chNum = (i / 8) * 3 + (i % 8) % 3;
		//Make sure we use 16 and up for the 2nd range to match the chanoffset gap
		if ( chNum >= 12 )
			chNum += 16 - 12;
		Bitu opNum = ( i % 8 ) / 3;
		DBOPL::Channel* chan = 0;
		Bitu blah = reinterpret_cast<size_t>( &(chan->op[opNum]) );
		OpOffsetTable[i] = ChanOffsetTable[ chNum ] + blah;
	}
#if 0
	//Stupid checks if table's are correct
	for ( Bitu i = 0; i < 18; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i ]) );
		for ( Bitu c = 0; c < 32; c++ ) {
			if ( ChanOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
	for ( Bitu i = 0; i < 36; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i / 2 ].op[i % 2]) );
		for ( Bitu c = 0; c < 64; c++ ) {
			if ( OpOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
#endif
}